

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OISInputManager.cpp
# Opt level: O1

void OIS::InputManager::destroyInputSystem(InputManager *manager)

{
  _Rb_tree_node_base *p_Var1;
  
  if (manager == (InputManager *)0x0) {
    return;
  }
  for (p_Var1 = (manager->mFactoryObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(manager->mFactoryObjects)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(*(long *)p_Var1[1]._M_parent + 0x38))
              (p_Var1[1]._M_parent,*(undefined8 *)(p_Var1 + 1));
  }
  std::
  _Rb_tree<OIS::Object_*,_std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>,_std::_Select1st<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_>,_std::less<OIS::Object_*>,_std::allocator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_>_>
  ::clear(&(manager->mFactoryObjects)._M_t);
  (*manager->_vptr_InputManager[2])(manager);
  return;
}

Assistant:

void InputManager::destroyInputSystem(InputManager* manager)
{
	if(manager == nullptr)
		return;

	//Cleanup before deleting...
	for(FactoryCreatedObject::iterator i = manager->mFactoryObjects.begin();
		i != manager->mFactoryObjects.end();
		++i)
	{
		i->second->destroyObject(i->first);
	}

	manager->mFactoryObjects.clear();
	delete manager;
}